

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::basic_json_encoder
          (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *sink,basic_json_encode_options<char> *options,allocator<char> *alloc)

{
  spaces_option sVar1;
  undefined2 *local_b8;
  undefined8 local_b0;
  undefined2 local_a8;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined4 uStack_a4;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  *local_48;
  write_double *local_40;
  basic_json_encode_options<char> *local_38;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_json_encoder_00b5ca60;
  (this->sink_).buf_ptr = (container_type *)0x0;
  (this->sink_).buf_ptr = sink->buf_ptr;
  sink->buf_ptr = (container_type *)0x0;
  local_38 = &this->options_;
  basic_json_encode_options<char>::basic_json_encode_options(local_38,options);
  local_40 = &this->fp_;
  detail::write_double::write_double(local_40,options->float_format_,(int)options->precision_);
  local_48 = &this->stack_;
  this->column_ = 0;
  local_50 = &this->colon_str_;
  local_58 = &(this->colon_str_).field_2;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->colon_str_)._M_dataplus._M_p = (pointer)local_58;
  (this->colon_str_)._M_string_length = 0;
  (this->colon_str_).field_2._M_local_buf[0] = '\0';
  local_98 = (string *)&this->comma_str_;
  local_60 = &(this->comma_str_).field_2;
  (this->comma_str_)._M_dataplus._M_p = (pointer)local_60;
  (this->comma_str_)._M_string_length = 0;
  (this->comma_str_).field_2._M_local_buf[0] = '\0';
  local_78 = (string *)&this->open_object_brace_str_;
  local_68 = &(this->open_object_brace_str_).field_2;
  (this->open_object_brace_str_)._M_dataplus._M_p = (pointer)local_68;
  (this->open_object_brace_str_)._M_string_length = 0;
  (this->open_object_brace_str_).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->close_object_brace_str_;
  local_70 = &(this->close_object_brace_str_).field_2;
  (this->close_object_brace_str_)._M_dataplus._M_p = (pointer)local_70;
  (this->close_object_brace_str_)._M_string_length = 0;
  (this->close_object_brace_str_).field_2._M_local_buf[0] = '\0';
  local_88 = (string *)&this->open_array_bracket_str_;
  (this->open_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->open_array_bracket_str_).field_2;
  (this->open_array_bracket_str_)._M_string_length = 0;
  (this->open_array_bracket_str_).field_2._M_local_buf[0] = '\0';
  local_90 = (string *)&this->close_array_bracket_str_;
  (this->close_array_bracket_str_)._M_dataplus._M_p =
       (pointer)&(this->close_array_bracket_str_).field_2;
  (this->close_array_bracket_str_)._M_string_length = 0;
  (this->close_array_bracket_str_).field_2._M_local_buf[0] = '\0';
  this->nesting_depth_ = 0;
  sVar1 = options->spaces_around_colon_;
  if (sVar1 == space_after) {
    local_a8 = 0x203a;
LAB_00294565:
    local_b0 = 2;
    uStack_a6 = 0;
LAB_00294572:
    local_b8 = &local_a8;
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8)))
                               + 1);
    }
  }
  else {
    if (sVar1 == space_before) {
      local_a8 = 0x3a20;
      goto LAB_00294565;
    }
    if (sVar1 == space_before_and_after) {
      local_a8 = 0x3a20;
      uStack_a6 = 0x20;
      uStack_a5 = 0;
      local_b0 = 3;
      goto LAB_00294572;
    }
    std::__cxx11::string::push_back((char)local_50);
  }
  sVar1 = options->spaces_around_comma_;
  if (sVar1 == space_before_and_after) {
    local_a8 = 0x2c20;
    uStack_a6 = 0x20;
    uStack_a5 = 0;
    local_b0 = 3;
  }
  else {
    if (sVar1 == space_before) {
      local_a8 = 0x2c20;
    }
    else {
      if (sVar1 != space_after) {
        std::__cxx11::string::push_back((char)local_98);
        goto LAB_00294634;
      }
      local_a8 = 0x202c;
    }
    local_b0 = 2;
    uStack_a6 = 0;
  }
  local_b8 = &local_a8;
  std::__cxx11::string::operator=(local_98,(string *)&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8))) +
                             1);
  }
LAB_00294634:
  if ((options->field_0x8 & 4) == 0) {
    std::__cxx11::string::push_back((char)local_78);
    std::__cxx11::string::push_back((char)local_80);
  }
  else {
    local_a8 = 0x207b;
    local_b0 = 2;
    uStack_a6 = 0;
    local_b8 = &local_a8;
    std::__cxx11::string::operator=(local_78,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8)))
                               + 1);
    }
    local_a8 = 0x7d20;
    local_b0 = 2;
    uStack_a6 = 0;
    local_b8 = &local_a8;
    std::__cxx11::string::operator=(local_80,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8)))
                               + 1);
    }
  }
  if ((options->field_0x8 & 8) == 0) {
    std::__cxx11::string::push_back((char)local_88);
    std::__cxx11::string::push_back((char)local_90);
  }
  else {
    local_a8 = 0x205b;
    local_b0 = 2;
    uStack_a6 = 0;
    local_b8 = &local_a8;
    std::__cxx11::string::operator=(local_88,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8)))
                               + 1);
    }
    local_a8 = 0x5d20;
    local_b0 = 2;
    uStack_a6 = 0;
    local_b8 = &local_a8;
    std::__cxx11::string::operator=(local_90,(string *)&local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,CONCAT44(uStack_a4,CONCAT13(uStack_a5,CONCAT12(uStack_a6,local_a8)))
                               + 1);
    }
  }
  return;
}

Assistant:

basic_json_encoder(Sink&& sink, 
                           const basic_json_encode_options<CharT>& options, 
                           const Allocator& alloc = Allocator())
           : sink_(std::forward<Sink>(sink)), 
             options_(options),
             fp_(options.float_format(), options.precision()),
             stack_(alloc)
        {
            switch (options.spaces_around_colon())
            {
                case spaces_option::space_after:
                    colon_str_ = std::basic_string<CharT>({':',' '});
                    break;
                case spaces_option::space_before:
                    colon_str_ = std::basic_string<CharT>({' ',':'});
                    break;
                case spaces_option::space_before_and_after:
                    colon_str_ = std::basic_string<CharT>({' ',':',' '});
                    break;
                default:
                    colon_str_.push_back(':');
                    break;
            }
            switch (options.spaces_around_comma())
            {
                case spaces_option::space_after:
                    comma_str_ = std::basic_string<CharT>({',',' '});
                    break;
                case spaces_option::space_before:
                    comma_str_ = std::basic_string<CharT>({' ',','});
                    break;
                case spaces_option::space_before_and_after:
                    comma_str_ = std::basic_string<CharT>({' ',',',' '});
                    break;
                default:
                    comma_str_.push_back(',');
                    break;
            }
            if (options.pad_inside_object_braces())
            {
                open_object_brace_str_ = std::basic_string<CharT>({'{', ' '});
                close_object_brace_str_ = std::basic_string<CharT>({' ', '}'});
            }
            else
            {
                open_object_brace_str_.push_back('{');
                close_object_brace_str_.push_back('}');
            }
            if (options.pad_inside_array_brackets())
            {
                open_array_bracket_str_ = std::basic_string<CharT>({'[', ' '});
                close_array_bracket_str_ = std::basic_string<CharT>({' ', ']'});
            }
            else
            {
                open_array_bracket_str_.push_back('[');
                close_array_bracket_str_.push_back(']');
            }
        }